

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall crnlib::dxt_hc::create_color_selector_codebook(dxt_hc *this)

{
  bool bVar1;
  unsigned_long_long uVar2;
  task_pool *ptVar3;
  undefined4 uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  float fVar9;
  unsigned_long_long *puVar10;
  ulong data;
  SelectorNode *pSVar11;
  size_type sVar12;
  const_reference pvVar13;
  float *pfVar14;
  uint *puVar15;
  vec<16U,_float> *pvVar16;
  vector<crnlib::color_selector_details> *pvVar17;
  color_selector_details *pcVar18;
  bool *pbVar19;
  uint (*pauVar20) [4];
  float fVar21;
  byte local_461;
  byte local_3f1;
  unsigned_long_long local_280;
  uint local_25c;
  uint8 s12;
  uint8 s03;
  uint *e;
  uint p_2;
  uint sh_1;
  uint (*errors) [16] [4];
  uint i_6;
  uint8 s_1;
  uint uStack_224;
  uint8 p_1;
  uint i_5;
  uint t_1;
  uint local_20c;
  undefined1 local_208 [4];
  uint t;
  vector<crnlib::vector<crnlib::color_selector_details>_> selector_details;
  uint j;
  uint sh;
  vec16F *v_1;
  undefined1 local_1e0 [4];
  uint i_4;
  tree_clusterizer<crnlib::vec<16U,_float>_> selector_vq;
  uint p;
  vec16F vector;
  uint weight;
  uint64 selector;
  SelectorNode node_1;
  uint64 prev_selector;
  vector<unsigned_int> weights;
  vector<crnlib::vec<16U,_float>_> vectors;
  float fStack_a8;
  uint s;
  float v [4];
  undefined1 local_90 [4];
  uint i_3;
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  queue;
  uint i_2;
  uint i_1;
  SelectorNode node;
  vector<crnlib::SelectorNode> nodes;
  uint local_30;
  uint step;
  uint b;
  uint i;
  vector<unsigned_long_long> selectors;
  uint num_tasks;
  dxt_hc *this_local;
  
  uVar7 = task_pool::get_num_threads(this->m_pTask_pool);
  selectors.m_capacity = uVar7 + 1;
  if ((this->m_has_subblocks & 1U) == 0) {
    local_25c = this->m_num_blocks;
  }
  else {
    local_25c = this->m_num_blocks >> 1;
  }
  vector<unsigned_long_long>::vector((vector<unsigned_long_long> *)&b,local_25c);
  step = 0;
  local_30 = 0;
  iVar8 = 1;
  if ((this->m_has_subblocks & 1U) != 0) {
    iVar8 = 2;
  }
  for (; local_30 < this->m_num_blocks; local_30 = iVar8 + local_30) {
    puVar10 = vector<unsigned_long_long>::operator[](this->m_block_selectors,local_30);
    uVar2 = *puVar10;
    if ((this->m_has_subblocks & 1U) == 0) {
      local_280 = 0;
    }
    else {
      puVar10 = vector<unsigned_long_long>::operator[](this->m_block_selectors,local_30 + 1);
      local_280 = *puVar10;
    }
    puVar10 = vector<unsigned_long_long>::operator[]((vector<unsigned_long_long> *)&b,step);
    *puVar10 = uVar2 + local_280;
    step = step + 1;
  }
  vector<crnlib::SelectorNode>::vector((vector<crnlib::SelectorNode> *)&node.pEnd);
  puVar10 = vector<unsigned_long_long>::get_ptr((vector<unsigned_long_long> *)&b);
  SelectorNode::SelectorNode((SelectorNode *)&i_2,(uint64 *)0x0,puVar10);
  for (queue._28_4_ = 0; (uint)queue._28_4_ < selectors.m_capacity; queue._28_4_ = queue._28_4_ + 1)
  {
    _i_2 = node.p;
    puVar10 = vector<unsigned_long_long>::get_ptr((vector<unsigned_long_long> *)&b);
    uVar7 = vector<unsigned_long_long>::size((vector<unsigned_long_long> *)&b);
    node.p = puVar10 + (ulong)(uVar7 * (queue._28_4_ + 1)) / (ulong)selectors.m_capacity;
    if (_i_2 != node.p) {
      vector<crnlib::SelectorNode>::push_back
                ((vector<crnlib::SelectorNode> *)&node.pEnd,(SelectorNode *)&i_2);
    }
  }
  for (queue._24_4_ = 0; uVar4 = queue._24_4_,
      uVar7 = vector<crnlib::SelectorNode>::size((vector<crnlib::SelectorNode> *)&node.pEnd),
      (uint)uVar4 < uVar7; queue._24_4_ = queue._24_4_ + 1) {
    ptVar3 = this->m_pTask_pool;
    data = (ulong)(uint)queue._24_4_;
    pSVar11 = vector<crnlib::SelectorNode>::operator[]
                        ((vector<crnlib::SelectorNode> *)&node.pEnd,queue._24_4_);
    task_pool::queue_task(ptVar3,SelectorNode::sort_task,data,pSVar11);
  }
  task_pool::join(this->m_pTask_pool);
  std::
  priority_queue<crnlib::SelectorNode,std::vector<crnlib::SelectorNode,std::allocator<crnlib::SelectorNode>>,std::less<crnlib::SelectorNode>>
  ::priority_queue<std::vector<crnlib::SelectorNode,std::allocator<crnlib::SelectorNode>>,void>
            ((priority_queue<crnlib::SelectorNode,std::vector<crnlib::SelectorNode,std::allocator<crnlib::SelectorNode>>,std::less<crnlib::SelectorNode>>
              *)local_90);
  for (v[3] = 0.0; fVar21 = v[3],
      fVar9 = (float)vector<crnlib::SelectorNode>::size((vector<crnlib::SelectorNode> *)&node.pEnd),
      (uint)fVar21 < (uint)fVar9; v[3] = (float)((int)v[3] + 1)) {
    pSVar11 = vector<crnlib::SelectorNode>::operator[]
                        ((vector<crnlib::SelectorNode> *)&node.pEnd,(uint)v[3]);
    std::
    priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
    ::push((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
            *)local_90,pSVar11);
  }
  for (vectors.m_capacity = 0; vectors.m_capacity < 4; vectors.m_capacity = vectors.m_capacity + 1)
  {
    (&fStack_a8)[vectors.m_capacity] = ((float)vectors.m_capacity + 0.5) * 0.25;
  }
  vector<crnlib::vec<16U,_float>_>::vector((vector<crnlib::vec<16U,_float>_> *)&weights.m_size);
  vector<unsigned_int>::vector((vector<unsigned_int> *)&prev_selector);
  uVar7 = vector<unsigned_long_long>::size((vector<unsigned_long_long> *)&b);
  vector<crnlib::vec<16U,_float>_>::reserve
            ((vector<crnlib::vec<16U,_float>_> *)&weights.m_size,uVar7);
  uVar7 = vector<unsigned_long_long>::size((vector<unsigned_long_long> *)&b);
  vector<unsigned_int>::reserve((vector<unsigned_int> *)&prev_selector,uVar7);
  node_1.pEnd = (uint64 *)0x0;
  while (sVar12 = std::
                  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
                  ::size((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
                          *)local_90), sVar12 != 0) {
    pvVar13 = std::
              priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
              ::top((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
                     *)local_90);
    node_1.p = pvVar13->pEnd;
    selector = (uint64)(pvVar13->p + 1);
    unique0x00012000 = (uint64 *)*pvVar13->p;
    std::
    priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
    ::pop((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
           *)local_90);
    if ((uint64 *)selector != node_1.p) {
      std::
      priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
      ::push((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
              *)local_90,(value_type *)&selector);
    }
    vector.m_s[0xe] = vector.m_s[0xf];
    unique0x100006b0 = (uint64 *)((ulong)stack0xffffffffffffff10 >> 0x20);
    uVar7 = vector<crnlib::vec<16U,_float>_>::size
                      ((vector<crnlib::vec<16U,_float>_> *)&weights.m_size);
    if ((uVar7 == 0) || (stack0xffffffffffffff10 != node_1.pEnd)) {
      node_1.pEnd = stack0xffffffffffffff10;
      vec<16U,_float>::vec((vec<16U,_float> *)&selector_vq.m_codebook.m_capacity);
      for (selector_vq.m_codebook.m_size = 0; selector_vq.m_codebook.m_size < 0x10;
          selector_vq.m_codebook.m_size = selector_vq.m_codebook.m_size + 1) {
        fVar21 = (&fStack_a8)[(uint)vector.m_s[0xf] & 3];
        pfVar14 = vec<16U,_float>::operator[]
                            ((vec<16U,_float> *)&selector_vq.m_codebook.m_capacity,
                             0xf - selector_vq.m_codebook.m_size);
        *pfVar14 = fVar21;
        register0x00000000 = (uint64 *)((ulong)stack0xffffffffffffff10 >> 2);
      }
      vector<crnlib::vec<16U,_float>_>::push_back
                ((vector<crnlib::vec<16U,_float>_> *)&weights.m_size,
                 (vec<16U,_float> *)&selector_vq.m_codebook.m_capacity);
      vector<unsigned_int>::push_back
                ((vector<unsigned_int> *)&prev_selector,(uint *)(vector.m_s + 0xe));
    }
    else {
      puVar15 = vector<unsigned_int>::back((vector<unsigned_int> *)&prev_selector);
      fVar21 = vector.m_s[0xe];
      if (-(int)vector.m_s[0xe] - 1U < *puVar15) {
        puVar15 = vector<unsigned_int>::back((vector<unsigned_int> *)&prev_selector);
        *puVar15 = 0xffffffff;
      }
      else {
        puVar15 = vector<unsigned_int>::back((vector<unsigned_int> *)&prev_selector);
        *puVar15 = (int)fVar21 + *puVar15;
      }
    }
  }
  tree_clusterizer<crnlib::vec<16U,_float>_>::tree_clusterizer
            ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1e0);
  pvVar16 = vector<crnlib::vec<16U,_float>_>::get_ptr
                      ((vector<crnlib::vec<16U,_float>_> *)&weights.m_size);
  puVar15 = vector<unsigned_int>::get_ptr((vector<unsigned_int> *)&prev_selector);
  uVar7 = vector<crnlib::vec<16U,_float>_>::size
                    ((vector<crnlib::vec<16U,_float>_> *)&weights.m_size);
  tree_clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
            ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1e0,pvVar16,puVar15,uVar7,
             (this->m_params).m_color_selector_codebook_size,false,this->m_pTask_pool);
  uVar7 = tree_clusterizer<crnlib::vec<16U,_float>_>::get_codebook_size
                    ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1e0);
  vector<unsigned_int>::resize(&this->m_color_selectors,uVar7,false);
  uVar7 = tree_clusterizer<crnlib::vec<16U,_float>_>::get_codebook_size
                    ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1e0);
  vector<bool>::resize(&this->m_color_selectors_used,uVar7,false);
  for (v_1._4_4_ = 0;
      uVar7 = tree_clusterizer<crnlib::vec<16U,_float>_>::get_codebook_size
                        ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1e0), v_1._4_4_ < uVar7
      ; v_1._4_4_ = v_1._4_4_ + 1) {
    pvVar16 = tree_clusterizer<crnlib::vec<16U,_float>_>::get_codebook_entry
                        ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1e0,v_1._4_4_);
    puVar15 = vector<unsigned_int>::operator[](&this->m_color_selectors,v_1._4_4_);
    *puVar15 = 0;
    selector_details.m_capacity = 0;
    for (selector_details.m_size = 0; selector_details.m_size < 0x10;
        selector_details.m_size = selector_details.m_size + 1) {
      fVar21 = vec<16U,_float>::operator[](pvVar16,selector_details.m_size);
      bVar6 = (byte)selector_details.m_capacity & 0x1f;
      puVar15 = vector<unsigned_int>::operator[](&this->m_color_selectors,v_1._4_4_);
      *puVar15 = (int)(long)(fVar21 * 4.0) << bVar6 | *puVar15;
      selector_details.m_capacity = selector_details.m_capacity + 2;
    }
  }
  vector<crnlib::vector<crnlib::color_selector_details>_>::vector
            ((vector<crnlib::vector<crnlib::color_selector_details>_> *)local_208,
             selectors.m_capacity);
  for (local_20c = 0; local_20c < selectors.m_capacity; local_20c = local_20c + 1) {
    pvVar17 = vector<crnlib::vector<crnlib::color_selector_details>_>::operator[]
                        ((vector<crnlib::vector<crnlib::color_selector_details>_> *)local_208,
                         local_20c);
    uVar7 = vector<unsigned_int>::size(&this->m_color_selectors);
    vector<crnlib::color_selector_details>::resize(pvVar17,uVar7,false);
    ptVar3 = this->m_pTask_pool;
    vector<crnlib::vector<crnlib::color_selector_details>_>::operator[]
              ((vector<crnlib::vector<crnlib::color_selector_details>_> *)local_208,local_20c);
    task_pool::queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
              (ptVar3,this,0x1d9f00,0,(void *)(ulong)local_20c);
  }
  task_pool::join(this->m_pTask_pool);
  for (uStack_224 = 1; uStack_224 < selectors.m_capacity; uStack_224 = uStack_224 + 1) {
    for (i_6 = 0; uVar7 = vector<unsigned_int>::size(&this->m_color_selectors), i_6 < uVar7;
        i_6 = i_6 + 1) {
      for (errors._7_1_ = 0; errors._7_1_ < 0x10; errors._7_1_ = errors._7_1_ + 1) {
        for (errors._6_1_ = 0; errors._6_1_ < 4; errors._6_1_ = errors._6_1_ + 1) {
          pvVar17 = vector<crnlib::vector<crnlib::color_selector_details>_>::operator[]
                              ((vector<crnlib::vector<crnlib::color_selector_details>_> *)local_208,
                               uStack_224);
          pcVar18 = vector<crnlib::color_selector_details>::operator[](pvVar17,i_6);
          uVar7 = pcVar18->error[errors._7_1_][errors._6_1_];
          pvVar17 = vector<crnlib::vector<crnlib::color_selector_details>_>::operator[]
                              ((vector<crnlib::vector<crnlib::color_selector_details>_> *)local_208,
                               0);
          pcVar18 = vector<crnlib::color_selector_details>::operator[](pvVar17,i_6);
          pcVar18->error[errors._7_1_][errors._6_1_] =
               uVar7 + pcVar18->error[errors._7_1_][errors._6_1_];
        }
      }
      pvVar17 = vector<crnlib::vector<crnlib::color_selector_details>_>::operator[]
                          ((vector<crnlib::vector<crnlib::color_selector_details>_> *)local_208,0);
      pcVar18 = vector<crnlib::color_selector_details>::operator[](pvVar17,i_6);
      local_3f1 = 1;
      if ((pcVar18->used & 1U) == 0) {
        pvVar17 = vector<crnlib::vector<crnlib::color_selector_details>_>::operator[]
                            ((vector<crnlib::vector<crnlib::color_selector_details>_> *)local_208,
                             uStack_224);
        pcVar18 = vector<crnlib::color_selector_details>::operator[](pvVar17,i_6);
        local_3f1 = pcVar18->used;
      }
      pvVar17 = vector<crnlib::vector<crnlib::color_selector_details>_>::operator[]
                          ((vector<crnlib::vector<crnlib::color_selector_details>_> *)local_208,0);
      pcVar18 = vector<crnlib::color_selector_details>::operator[](pvVar17,i_6);
      pcVar18->used = (bool)(local_3f1 & 1);
    }
  }
  for (errors._0_4_ = 0; uVar7 = vector<unsigned_int>::size(&this->m_color_selectors),
      (uint)errors < uVar7; errors._0_4_ = (uint)errors + 1) {
    pvVar17 = vector<crnlib::vector<crnlib::color_selector_details>_>::operator[]
                        ((vector<crnlib::vector<crnlib::color_selector_details>_> *)local_208,0);
    pcVar18 = vector<crnlib::color_selector_details>::operator[](pvVar17,(uint)errors);
    bVar1 = pcVar18->used;
    pbVar19 = vector<bool>::operator[](&this->m_color_selectors_used,(uint)errors);
    *pbVar19 = (bool)(bVar1 & 1);
    pvVar17 = vector<crnlib::vector<crnlib::color_selector_details>_>::operator[]
                        ((vector<crnlib::vector<crnlib::color_selector_details>_> *)local_208,0);
    pcVar18 = vector<crnlib::color_selector_details>::operator[](pvVar17,(uint)errors);
    puVar15 = vector<unsigned_int>::operator[](&this->m_color_selectors,(uint)errors);
    *puVar15 = 0;
    bVar6 = 0;
    for (e._0_4_ = 0; (uint)e < 0x10; e._0_4_ = (uint)e + 1) {
      pauVar20 = pcVar18->error + (uint)e;
      local_461 = 0;
      if ((*pauVar20)[3] < (*pauVar20)[0]) {
        local_461 = 3;
      }
      bVar5 = 1;
      if ((*pauVar20)[2] < (*pauVar20)[1]) {
        bVar5 = 2;
      }
      if ((*pauVar20)[bVar5] < (*pauVar20)[local_461]) {
        local_461 = bVar5;
      }
      puVar15 = vector<unsigned_int>::operator[](&this->m_color_selectors,(uint)errors);
      *puVar15 = (uint)local_461 << (bVar6 & 0x1f) | *puVar15;
      bVar6 = bVar6 + 2;
    }
  }
  vector<crnlib::vector<crnlib::color_selector_details>_>::~vector
            ((vector<crnlib::vector<crnlib::color_selector_details>_> *)local_208);
  tree_clusterizer<crnlib::vec<16U,_float>_>::~tree_clusterizer
            ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1e0);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)&prev_selector);
  vector<crnlib::vec<16U,_float>_>::~vector((vector<crnlib::vec<16U,_float>_> *)&weights.m_size);
  std::
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  ::~priority_queue((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
                     *)local_90);
  vector<crnlib::SelectorNode>::~vector((vector<crnlib::SelectorNode> *)&node.pEnd);
  vector<unsigned_long_long>::~vector((vector<unsigned_long_long> *)&b);
  return;
}

Assistant:

void dxt_hc::create_color_selector_codebook()
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        crnlib::vector<uint64> selectors(m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks);
        for (uint i = 0, b = 0, step = m_has_subblocks ? 2 : 1; b < m_num_blocks; b += step)
        {
            selectors[i++] = m_block_selectors[cColor][b] + (m_has_subblocks ? m_block_selectors[cColor][b + 1] : 0);
        }

        crnlib::vector<SelectorNode> nodes;
        SelectorNode node(0, selectors.get_ptr());
        for (uint i = 0; i < num_tasks; i++)
        {
            node.p = node.pEnd;
            node.pEnd = selectors.get_ptr() + selectors.size() * (i + 1) / num_tasks;
            if (node.p != node.pEnd)
            {
                nodes.push_back(node);
            }
        }

        for (uint i = 0; i < nodes.size(); i++)
        {
            m_pTask_pool->queue_task(&SelectorNode::sort_task, i, &nodes[i]);
        }
        m_pTask_pool->join();

        std::priority_queue<SelectorNode> queue;
        for (uint i = 0; i < nodes.size(); i++)
        {
            queue.push(nodes[i]);
        }

        float v[4];
        for (uint s = 0; s < 4; s++)
        {
            v[s] = (s + 0.5f) * 0.25f;
        }

        crnlib::vector<vec16F> vectors;
        crnlib::vector<uint> weights;
        vectors.reserve(selectors.size());
        weights.reserve(selectors.size());
        for (uint64 prev_selector = 0; queue.size();)
        {
            SelectorNode node = queue.top();
            uint64 selector = *node.p++;
            queue.pop();
            if (node.p != node.pEnd)
            {
                queue.push(node);
            }
            uint weight = (uint)selector;
            selector >>= 32;
            if (!vectors.size() || selector != prev_selector)
            {
                prev_selector = selector;
                vec16F vector;
                for (uint p = 0; p < 16; p++, selector >>= 2)
                {
                    vector[15 - p] = v[selector & 3];
                }
                vectors.push_back(vector);
                weights.push_back(weight);
            }
            else if (weights.back() > UINT_MAX - weight)
            {
                weights.back() = UINT_MAX;
            }
            else
            {
                weights.back() += weight;
            }
        }

        tree_clusterizer<vec16F> selector_vq;
        selector_vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), m_params.m_color_selector_codebook_size, false, m_pTask_pool);
        m_color_selectors.resize(selector_vq.get_codebook_size());
        m_color_selectors_used.resize(selector_vq.get_codebook_size());
        for (uint i = 0; i < selector_vq.get_codebook_size(); i++)
        {
            const vec16F& v = selector_vq.get_codebook_entry(i);
            m_color_selectors[i] = 0;
            for (uint sh = 0, j = 0; j < 16; j++, sh += 2)
            {
                m_color_selectors[i] |= (uint)(v[j] * 4.0f) << sh;
            }
        }

        crnlib::vector<crnlib::vector<color_selector_details>> selector_details(num_tasks);
        for (uint t = 0; t < num_tasks; t++)
        {
            selector_details[t].resize(m_color_selectors.size());
            m_pTask_pool->queue_object_task(this, &dxt_hc::create_color_selector_codebook_task, t, &selector_details[t]);
        }
        m_pTask_pool->join();

        for (uint t = 1; t < num_tasks; t++)
        {
            for (uint i = 0; i < m_color_selectors.size(); i++)
            {
                for (uint8 p = 0; p < 16; p++)
                {
                    for (uint8 s = 0; s < 4; s++)
                    {
                        selector_details[0][i].error[p][s] += selector_details[t][i].error[p][s];
                    }
                }
                selector_details[0][i].used = selector_details[0][i].used || selector_details[t][i].used;
            }
        }

        for (uint i = 0; i < m_color_selectors.size(); i++)
        {
            m_color_selectors_used[i] = selector_details[0][i].used;
            uint(&errors)[16][4] = selector_details[0][i].error;
            m_color_selectors[i] = 0;
            for (uint sh = 0, p = 0; p < 16; p++, sh += 2)
            {
                uint* e = errors[p];
                uint8 s03 = e[3] < e[0] ? 3 : 0;
                uint8 s12 = e[2] < e[1] ? 2 : 1;
                m_color_selectors[i] |= (e[s12] < e[s03] ? s12 : s03) << sh;
            }
        }
    }